

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestNoExplicitOutput::~ParserTestNoExplicitOutput(ParserTestNoExplicitOutput *this)

{
  ParserTestNoExplicitOutput *this_local;
  
  ~ParserTestNoExplicitOutput(this);
  operator_delete(this,0x248);
  return;
}

Assistant:

TEST_F(ParserTest, NoExplicitOutput) {
  ManifestParser parser(&state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest(
"rule cat\n"
"  command = cat $in > $out\n"
"build | imp : cat bar\n", &err));
}